

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O3

void __thiscall MP1Node::nodeLoopOps(MP1Node *this)

{
  Member **__return_storage_ptr__;
  Member *pMVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  MP1Node *pMVar5;
  pointer pMVar6;
  Address toAddr;
  Address local_78;
  MP1Node local_70;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"start nodeLoopOps...",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  iVar3 = Params::getcurrtime(this->par);
  if ((3 < iVar3) &&
     (pMVar1 = this->memberNode,
     1 < (ulong)(((long)(pMVar1->memberList).
                        super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pMVar1->memberList).
                        super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
    __return_storage_ptr__ = &local_70.memberNode;
    pMVar5 = (MP1Node *)__return_storage_ptr__;
    Address::getAddress_abi_cxx11_((string *)__return_storage_ptr__,&pMVar1->addr);
    iVar3 = getIdFromAddress(pMVar5,(string *)__return_storage_ptr__);
    if (local_70.memberNode != (Member *)&stack0xffffffffffffffc0) {
      operator_delete(local_70.memberNode);
    }
    pMVar5 = &local_70;
    Address::getAddress_abi_cxx11_((string *)&local_70,&this->memberNode->addr);
    sVar2 = getPortFromAddress(pMVar5,(string *)&local_70);
    if ((Log **)local_70._vptr_MP1Node != &local_70.log) {
      operator_delete(local_70._vptr_MP1Node);
    }
    for (pMVar6 = (this->memberNode->memberList).
                  super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar6 != (this->memberNode->memberList).
                  super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish; pMVar6 = pMVar6 + 1) {
      if ((pMVar6->id == iVar3) && (pMVar6->port == sVar2)) {
        iVar3 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp(pMVar6,(long)iVar3);
        pMVar6->heartbeat = pMVar6->heartbeat + 1;
        break;
      }
    }
    iVar3 = rand();
    pMVar6 = (this->memberNode->memberList).
             super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = (int)((ulong)(long)iVar3 %
                 (((long)(this->memberNode->memberList).
                         super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
                  -0x5555555555555555 - 1U)) + 1;
    iVar3 = Params::getcurrtime(this->par);
    if (5 < (long)iVar3 - pMVar6[iVar4].timestamp) {
      return;
    }
    local_78.addr._0_4_ = pMVar6[iVar4].id;
    local_78.addr._4_2_ = pMVar6[iVar4].port;
    sendMembershipList(this,&local_78,HEARTBEATREQ);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"...end nodeLoopOps.",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void MP1Node::nodeLoopOps() {
    cout << "start nodeLoopOps..." << endl;

    //completess and accuracy tests fail when this executed of par->getcurrtime() <= 3
    if (par->getcurrtime() > 3 && memberNode->memberList.size() > 1) {

        //update own node's heartbeat and timestamp
        int id = getIdFromAddress(memberNode->addr.getAddress());
        short port = getPortFromAddress(memberNode->addr.getAddress());
        for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin();
             entry != memberNode->memberList.end(); entry++) {
            if (entry->id == id && entry->port == port) {
                entry->settimestamp(par->getcurrtime());
                entry->heartbeat = entry->heartbeat + 1;
                break;
            }
        }

        //GOSSIP PROTOCOL: pick a random member to send the member list to
        int randomIndex = rand() % (memberNode->memberList.size() - 1) + 1;
        MemberListEntry &entry = memberNode->memberList[randomIndex];

        //check if that node has failed before sending member list to it
        if (par->getcurrtime() - entry.timestamp > TFAIL) {
            return;
        }

        //send member list
        Address toAddr;
        memcpy(&toAddr.addr[0], &entry.id, sizeof(int));
        memcpy(&toAddr.addr[4], &entry.port, sizeof(short));
        this->sendMembershipList(&toAddr, HEARTBEATREQ);
    }

    cout << "...end nodeLoopOps." << endl;
    return;
}